

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::Transaction::RemoveTxOut(Transaction *this,uint32_t index)

{
  __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
  local_20;
  const_iterator ite;
  uint32_t index_local;
  Transaction *this_local;
  
  ite._M_current._4_4_ = index;
  AbstractTransaction::RemoveTxOut(&this->super_AbstractTransaction,index);
  local_20._M_current =
       (TxOut *)::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::cbegin
                          (&this->vout_);
  if (ite._M_current._4_4_ != 0) {
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxOut_*,_std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>_>
    ::operator+=(&local_20,(ulong)ite._M_current._4_4_);
  }
  ::std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::erase
            (&this->vout_,(const_iterator)local_20._M_current);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,0x400);
  return;
}

Assistant:

void Transaction::RemoveTxOut(uint32_t index) {
  AbstractTransaction::RemoveTxOut(index);

  std::vector<TxOut>::const_iterator ite = vout_.cbegin();
  if (index != 0) {
    ite += index;
  }
  vout_.erase(ite);
  CallbackStateChange(kStateChangeRemoveTxOut);
}